

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPRThreadPoolTest1.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ThreadPool *this;
  int iVar1;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this = (ThreadPool *)operator_new(0xe8);
  thread::ThreadPool::ThreadPool(this,2);
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x10);
  *(code **)local_50._M_unused._0_8_ = print;
  *(ThreadPool **)((long)local_50._M_unused._0_8_ + 8) = this;
  local_38 = std::
             _Function_handler<void_(),_std::_Bind<void_(*(thread::ThreadPool_*))(thread::ThreadPool_*)>_>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_std::_Bind<void_(*(thread::ThreadPool_*))(thread::ThreadPool_*)>_>
             ::_M_manager;
  if (this->started == false) {
    std::function<void_()>::operator=(&this->threadfunc,(function<void_()> *)&local_50);
    if (local_40 == (code *)0x0) goto LAB_001024ba;
  }
  (*local_40)(&local_50,&local_50,__destroy_functor);
LAB_001024ba:
  thread::ThreadPool::start();
  iVar1 = 0;
  do {
    local_50._8_8_ = 0;
    local_50._M_unused._M_object = operator_new(0x10);
    *(code **)local_50._M_unused._0_8_ = fs;
    *(int *)((long)local_50._M_unused._0_8_ + 8) = iVar1;
    local_38 = std::_Function_handler<void_(),_std::_Bind<void_(*(int))(int)>_>::_M_invoke;
    local_40 = std::_Function_handler<void_(),_std::_Bind<void_(*(int))(int)>_>::_M_manager;
    thread::ThreadPool::addInTaskQueue((function *)this);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    sleep(1);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 10);
  thread::ThreadPool::joinAll();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sleep~",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  sleep(2);
  return 0;
}

Assistant:

int main(int argc,char** argv)
{

    thread::ThreadPool* pool = new thread::ThreadPool(2);
    
    pool->setThreadCallBack(std::bind(&print,pool));

    pool->start();

    for(int i=0;i<10;++i)
    {
        pool->addInTaskQueue(std::bind(&fs,i));
        sleep(1);
    }

    pool->joinAll();

    std::cout << "sleep~" << std::endl;
    sleep(2);

    return 0;
}